

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

int __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::FindKey
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *C)

{
  Addr p;
  Addr p_00;
  Addr p_01;
  __type _Var1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  bool local_169;
  bool local_161;
  string local_138 [32];
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  Addr local_b8;
  Addr local_b0;
  Addr local_98;
  undefined4 local_90;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> D;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *C_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  D.self = (Addr)C;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_88,this->N);
  if ((this->RootAddr).FileOff == -1) {
    this_local._4_4_ = -1;
  }
  else {
    local_98 = this->RootAddr;
    FindNode(this,local_98,
             (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)D.self);
    while (*(char *)D.self != '1') {
      local_8c = 0;
      while( true ) {
        local_161 = false;
        if (local_8c < this->N + -1) {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)((long)D.self + 0x20),
                              (long)local_8c);
          local_161 = false;
          if (*pvVar4 == '1') {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)D.self + 8),(long)local_8c);
            local_161 = std::operator>(k,pvVar5);
          }
        }
        if (local_161 == false) break;
        local_8c = local_8c + 1;
      }
      if ((local_8c == this->N + -1) ||
         (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)((long)D.self + 0x20),
                              (long)local_8c), *pvVar4 == '0')) {
        pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                            (long)local_8c);
        local_b0.BlockNum = pvVar6->BlockNum;
        local_b0.FileOff = pvVar6->FileOff;
        FindNode(this,local_b0,
                 (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)D.self);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)D.self + 8),(long)local_8c);
        _Var1 = std::operator==(k,pvVar5);
        if (_Var1) {
          pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                              (long)local_8c);
          local_b8.BlockNum = pvVar6->BlockNum;
          local_b8.FileOff = pvVar6->FileOff;
          FindNode(this,local_b8,
                   (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_88);
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::IndexNode(&local_118,
                      (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_88);
          std::__cxx11::string::string(local_138,(string *)k);
          iVar3 = HaveK(this,&local_118,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_138);
          std::__cxx11::string::~string(local_138);
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~IndexNode(&local_118);
          if (iVar3 == 0) {
            pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                                (long)(local_8c + 1));
            p_00.BlockNum = pvVar6->BlockNum;
            p_00.FileOff = pvVar6->FileOff;
            FindNode(this,p_00,
                     (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)D.self);
          }
          else {
            pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                                (long)local_8c);
            p.BlockNum = pvVar6->BlockNum;
            p.FileOff = pvVar6->FileOff;
            FindNode(this,p,(IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)D.self);
          }
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)D.self + 8),(long)local_8c);
          bVar2 = std::operator<(k,pvVar5);
          if (bVar2) {
            pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)((long)D.self + 0x38),
                                (long)local_8c);
            p_01.BlockNum = pvVar6->BlockNum;
            p_01.FileOff = pvVar6->FileOff;
            FindNode(this,p_01,
                     (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)D.self);
          }
        }
      }
    }
    local_8c = 0;
    while( true ) {
      local_169 = false;
      if (local_8c < this->N + -1) {
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)((long)D.self + 0x20),
                            (long)local_8c);
        local_169 = false;
        if (*pvVar4 == '1') {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)D.self + 8),(long)local_8c);
          local_169 = std::operator!=(k,pvVar5);
        }
      }
      if (local_169 == false) break;
      local_8c = local_8c + 1;
    }
    if ((local_8c == this->N + -1) ||
       (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)((long)D.self + 0x20),
                            (long)local_8c), *pvVar4 == '0')) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = local_8c;
    }
  }
  local_90 = 1;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_88);
  return this_local._4_4_;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}